

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double Alg::min_vector_nonzero_mask
                 (vector<double,_std::allocator<double>_> *budget_list,
                 vector<bool,_std::allocator<bool>_> *mask)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  pdVar2 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    dVar6 = 4294967295.0;
    uVar4 = 0;
    do {
      dVar1 = pdVar2[uVar4];
      if ((dVar1 < dVar6) && (0.0001 < ABS(dVar1))) {
        uVar5 = uVar4 + 0x3f;
        if (-1 < (long)uVar4) {
          uVar5 = uVar4;
        }
        if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar5 >> 6) +
              (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar4 & 0x3f) & 1) == 0) {
          dVar6 = dVar1;
        }
      }
      uVar4 = uVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != uVar4);
    return dVar6;
  }
  return 4294967295.0;
}

Assistant:

double Alg::min_vector_nonzero_mask(const std::vector<double> & budget_list, const std::vector<bool> & mask) {
    double tmp = WINT_MAX;
    const double esp = 0.0001;
    for (size_t i = 0; i < budget_list.size(); i++) {
        if (budget_list[i] < tmp && fabs(budget_list[i]) > esp && mask[i] == false) {
            tmp = budget_list[i];
        }
    }
    return tmp;
}